

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int CMdo_non_CM_handler(CMConnection conn,int header,char *buffer,size_t length)

{
  int iVar1;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  CMConnection in_RDI;
  int i;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if (foreign_handler_count <= local_2c) {
      return -1;
    }
    if (foreign_handler_list[local_2c].header == in_ESI) break;
    local_2c = local_2c + 1;
  }
  iVar1 = (*foreign_handler_list[local_2c].handler)(in_RDI,in_RDI->trans,in_RDX,in_RCX);
  return iVar1;
}

Assistant:

int
 CMdo_non_CM_handler(CMConnection conn, int header, char *buffer, size_t length)
 {
     int i = 0;
     while (i < foreign_handler_count) {
	 if (foreign_handler_list[i].header == header) {
	     return foreign_handler_list[i].handler(conn, conn->trans, buffer, 
					     length);
	 }
	 i++;
     }
     return -1;
 }